

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

int __thiscall QFutureInterfaceBase::progressMaximum(QFutureInterfaceBase *this)

{
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  ProgressData *pPVar1;
  int iVar2;
  bool bVar3;
  
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar3 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar3) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar3) goto LAB_001ee626;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001ee626:
  pPVar1 = (this->d->m_progress).d;
  if (pPVar1 == (ProgressData *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pPVar1->maximum;
  }
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  return iVar2;
}

Assistant:

int QFutureInterfaceBase::progressMaximum() const
{
    const QMutexLocker lock(&d->m_mutex);
    return d->m_progress ? d->m_progress->maximum : 0;
}